

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

String * kj::_::generateExtensionResponse
                   (String *__return_storage_ptr__,CompressionParameters *parameters)

{
  char (*in_RCX) [29];
  char (*in_RDX) [19];
  unsigned_long *in_R8;
  String response;
  unsigned_long w;
  Array<char> local_50;
  Array<char> local_38;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_18;
  
  str<char_const(&)[19]>((String *)&local_38,(kj *)"permessage-deflate",in_RDX);
  if (parameters->inboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>
              ((String *)&local_50,(kj *)&local_38,(String *)"; client_no_context_takeover",in_RCX);
    Array<char>::operator=(&local_38,&local_50);
    Array<char>::~Array(&local_50);
  }
  if (parameters->outboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>
              ((String *)&local_50,(kj *)&local_38,(String *)"; server_no_context_takeover",in_RCX);
    Array<char>::operator=(&local_38,&local_50);
    Array<char>::~Array(&local_50);
  }
  if ((parameters->inboundMaxWindowBits).ptr.isSet == true) {
    local_18 = (parameters->inboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              ((String *)&local_50,(kj *)&local_38,(String *)"; client_max_window_bits=",
               (char (*) [26])&local_18,in_R8);
    Array<char>::operator=(&local_38,&local_50);
    Array<char>::~Array(&local_50);
  }
  if ((parameters->outboundMaxWindowBits).ptr.isSet == true) {
    local_18 = (parameters->outboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              ((String *)&local_50,(kj *)&local_38,(String *)"; server_max_window_bits=",
               (char (*) [26])&local_18,in_R8);
    Array<char>::operator=(&local_38,&local_50);
    Array<char>::~Array(&local_50);
  }
  (__return_storage_ptr__->content).ptr = local_38.ptr;
  (__return_storage_ptr__->content).size_ = local_38.size_;
  (__return_storage_ptr__->content).disposer = local_38.disposer;
  local_38.ptr = (char *)0x0;
  local_38.size_ = 0;
  Array<char>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::String generateExtensionResponse(const CompressionParameters& parameters) {
  // Build the `Sec-WebSocket-Extensions` response from the agreed parameters.
  kj::String response = kj::str("permessage-deflate");
  if (parameters.inboundNoContextTakeover) {
    response = kj::str(response, "; client_no_context_takeover");
  }
  if (parameters.outboundNoContextTakeover) {
    response = kj::str(response, "; server_no_context_takeover");
  }
  if (parameters.inboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.inboundMaxWindowBits);
    response = kj::str(response, "; client_max_window_bits=", w);
  }
  if (parameters.outboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.outboundMaxWindowBits);
    response = kj::str(response, "; server_max_window_bits=", w);
  }
  return kj::mv(response);
}